

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManLutParams(Gia_Man_t *p,int *pnCurLuts,int *pnCurEdges,int *pnCurLevels)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  void *__ptr;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  if (((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
     (iVar6 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar6 == 0)) {
    __ptr = calloc((long)p->nObjs,4);
    *pnCurLuts = 0;
    *pnCurEdges = 0;
    if (1 < p->nObjs) {
      pVVar4 = p->vMapping;
      lVar7 = 1;
      do {
        if (pVVar4->nSize <= lVar7) {
LAB_0020b684:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar5 = pVVar4->pArray;
        if (piVar5[lVar7] != 0) {
          *pnCurLuts = *pnCurLuts + 1;
          if (pVVar4->nSize <= lVar7) goto LAB_0020b684;
          iVar6 = piVar5[lVar7];
          if (((long)iVar6 < 0) || (pVVar4->nSize <= iVar6)) goto LAB_0020b684;
          *pnCurEdges = *pnCurEdges + piVar5[iVar6];
          iVar6 = pVVar4->nSize;
          if (iVar6 <= lVar7) goto LAB_0020b684;
          uVar1 = piVar5[lVar7];
          if (((int)uVar1 < 0) || (iVar6 <= (int)uVar1)) goto LAB_0020b684;
          uVar2 = piVar5[uVar1];
          uVar9 = 0;
          uVar8 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar8 = uVar9;
          }
          iVar10 = 0;
          while (uVar8 != uVar9) {
            iVar3 = *(int *)((long)__ptr + (long)(piVar5 + uVar1)[uVar9 + 1] * 4);
            if (iVar10 <= iVar3) {
              iVar10 = iVar3;
            }
            uVar9 = uVar9 + 1;
            if (iVar6 <= lVar7) goto LAB_0020b684;
          }
          *(int *)((long)__ptr + lVar7 * 4) = iVar10 + 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->nObjs);
    }
    *pnCurLevels = 0;
    pVVar4 = p->vCos;
    if (0 < pVVar4->nSize) {
      piVar5 = pVVar4->pArray;
      lVar7 = 0;
      do {
        iVar6 = piVar5[lVar7];
        if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        iVar6 = *(int *)((long)__ptr +
                        (long)(int)(iVar6 - (*(uint *)(p->pObjs + iVar6) & 0x1fffffff)) * 4);
        if (*pnCurLevels < iVar6) {
          *pnCurLevels = iVar6;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar4->nSize);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
      return;
    }
  }
  else {
    *pnCurLuts = 0;
    *pnCurEdges = 0;
    if (1 < p->nObjs) {
      pVVar4 = p->vMapping;
      lVar7 = 1;
      do {
        if (pVVar4->nSize <= lVar7) goto LAB_0020b684;
        piVar5 = pVVar4->pArray;
        if (piVar5[lVar7] != 0) {
          *pnCurLuts = *pnCurLuts + 1;
          if (pVVar4->nSize <= lVar7) goto LAB_0020b684;
          iVar6 = piVar5[lVar7];
          if (((long)iVar6 < 0) || (pVVar4->nSize <= iVar6)) goto LAB_0020b684;
          *pnCurEdges = *pnCurEdges + piVar5[iVar6];
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->nObjs);
    }
    iVar6 = Gia_ManLutLevelWithBoxes(p);
    *pnCurLevels = iVar6;
  }
  return;
}

Assistant:

void Gia_ManLutParams( Gia_Man_t * p, int * pnCurLuts, int * pnCurEdges, int * pnCurLevels )
{
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
    {
        int i;
        *pnCurLuts = 0;
        *pnCurEdges = 0;
        Gia_ManForEachLut( p, i )
        {
            (*pnCurLuts)++;
            (*pnCurEdges) += Gia_ObjLutSize(p, i);
        }
        *pnCurLevels = Gia_ManLutLevelWithBoxes( p );
    }
    else
    {
        Gia_Obj_t * pObj;
        int i, k, iFan;
        int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
        *pnCurLuts = 0;
        *pnCurEdges = 0;
        Gia_ManForEachLut( p, i )
        {
            int Level = 0;
            (*pnCurLuts)++;
            (*pnCurEdges) += Gia_ObjLutSize(p, i);
            Gia_LutForEachFanin( p, i, iFan, k )
                if ( Level < pLevels[iFan] )
                    Level = pLevels[iFan];
            pLevels[i] = Level + 1;
        }
        *pnCurLevels = 0;
        Gia_ManForEachCo( p, pObj, k )
            if ( *pnCurLevels < pLevels[Gia_ObjFaninId0p(p, pObj)] )
                *pnCurLevels = pLevels[Gia_ObjFaninId0p(p, pObj)];
        ABC_FREE( pLevels );
    }
}